

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

uint32_t verify_miniscript_or_i_property(uint32_t x_property,uint32_t y_property)

{
  undefined4 local_18;
  uint32_t prop;
  uint32_t y_property_local;
  uint32_t x_property_local;
  
  if ((x_property & y_property & 7) == 0) {
    y_property_local = 0;
  }
  else {
    local_18 = (x_property | y_property) & 0x800 | x_property & y_property & 0xd007 | 0x20000;
    if ((x_property & y_property & 0x100) != 0) {
      local_18 = local_18 | 0x200;
    }
    if (((x_property | y_property) & 0x4000) != 0) {
      local_18 = (x_property | y_property) & 0x2000 | local_18;
    }
    if (((x_property | y_property) & 0x8000) != 0) {
      local_18 = x_property & y_property & 0x10000 | local_18;
    }
    y_property_local = local_18;
  }
  return y_property_local;
}

Assistant:

static uint32_t verify_miniscript_or_i_property(uint32_t x_property, uint32_t y_property)
{
    uint32_t prop = MINISCRIPT_PROPERTY_X;
    prop |= x_property & y_property &
            (MINISCRIPT_TYPE_V | MINISCRIPT_TYPE_B | MINISCRIPT_TYPE_K |
             MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_F | MINISCRIPT_PROPERTY_S);
    if (!(prop & MINISCRIPT_TYPE_MASK))
        return 0;

    prop |= (x_property | y_property) & MINISCRIPT_PROPERTY_D;
    if ((x_property & y_property) & MINISCRIPT_PROPERTY_Z)
        prop |= MINISCRIPT_PROPERTY_O;
    if ((x_property | y_property) & MINISCRIPT_PROPERTY_F)
        prop |= (x_property | y_property) & MINISCRIPT_PROPERTY_E;
    if ((x_property | y_property) & MINISCRIPT_PROPERTY_S)
        prop |= x_property & y_property & MINISCRIPT_PROPERTY_M;

    return prop;
}